

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

boolean encode_mcu_AC_first(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  short sVar1;
  int iVar2;
  int iVar3;
  huff_entropy_ptr entropy;
  jpeg_destination_mgr *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  jpeg_error_mgr *pjVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int symbol;
  int iVar12;
  long lVar13;
  
  entropy = (huff_entropy_ptr)cinfo->entropy;
  pjVar4 = cinfo->dest;
  entropy->next_output_byte = pjVar4->next_output_byte;
  entropy->free_in_buffer = pjVar4->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  iVar2 = cinfo->Se;
  iVar3 = cinfo->Al;
  piVar5 = cinfo->natural_order;
  paJVar6 = *MCU_data;
  lVar13 = (long)cinfo->Ss;
  iVar12 = 0;
  do {
    if (iVar2 < lVar13) {
      if ((0 < iVar12) && (uVar11 = entropy->EOBRUN + 1, entropy->EOBRUN = uVar11, uVar11 == 0x7fff)
         ) {
        emit_eobrun(entropy);
      }
      pjVar4 = cinfo->dest;
      pjVar4->next_output_byte = entropy->next_output_byte;
      pjVar4->free_in_buffer = entropy->free_in_buffer;
      uVar11 = cinfo->restart_interval;
      if (uVar11 != 0) {
        uVar9 = entropy->restarts_to_go;
        if (entropy->restarts_to_go == 0) {
          entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
          uVar9 = uVar11;
        }
        entropy->restarts_to_go = uVar9 - 1;
      }
      return 1;
    }
    sVar1 = (*paJVar6)[piVar5[lVar13]];
    if (sVar1 == 0) {
LAB_001d4319:
      iVar12 = iVar12 + 1;
    }
    else {
      bVar8 = (byte)iVar3;
      uVar10 = (uint)-(int)sVar1 >> (bVar8 & 0x1f);
      uVar11 = (uint)(int)sVar1 >> (bVar8 & 0x1f);
      uVar9 = uVar11;
      if (sVar1 < 0) {
        uVar11 = uVar10;
        uVar9 = ~uVar10;
      }
      if (uVar11 == 0) goto LAB_001d4319;
      if (entropy->EOBRUN != 0) {
        emit_eobrun(entropy);
      }
      symbol = iVar12 * 0x10 + 1;
      for (; 0xf < iVar12; iVar12 = iVar12 + -0x10) {
        emit_ac_symbol(entropy,entropy->ac_tbl_no,0xf0);
        symbol = symbol + -0x100;
      }
      uVar10 = 1;
      for (; 1 < uVar11; uVar11 = uVar11 >> 1) {
        uVar10 = uVar10 + 1;
        symbol = symbol + 1;
      }
      if (10 < uVar10) {
        pjVar7 = cinfo->err;
        pjVar7->msg_code = 6;
        (*pjVar7->error_exit)((j_common_ptr)cinfo);
      }
      emit_ac_symbol(entropy,entropy->ac_tbl_no,symbol);
      emit_bits_e(entropy,uVar9,uVar10);
      iVar12 = 0;
    }
    lVar13 = lVar13 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_first (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp, temp2;
  register int nbits;
  register int r, k;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  Se = cinfo->Se;
  Al = cinfo->Al;
  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];

  /* Encode the AC coefficients per section G.1.2.2, fig. G.3 */
  
  r = 0;			/* r = run length of zeros */
   
  for (k = cinfo->Ss; k <= Se; k++) {
    if ((temp = (*block)[natural_order[k]]) == 0) {
      r++;
      continue;
    }
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value; so the code is
     * interwoven with finding the abs value (temp) and output bits (temp2).
     */
    if (temp < 0) {
      temp = -temp;		/* temp is abs value of input */
      temp >>= Al;		/* apply the point transform */
      /* For a negative coef, want temp2 = bitwise complement of abs(coef) */
      temp2 = ~temp;
    } else {
      temp >>= Al;		/* apply the point transform */
      temp2 = temp;
    }
    /* Watch out for case that nonzero coef is zero after point transform */
    if (temp == 0) {
      r++;
      continue;
    }

    /* Emit any pending EOBRUN */
    if (entropy->EOBRUN > 0)
      emit_eobrun(entropy);
    /* if run length > 15, must emit special run-length-16 codes (0xF0) */
    while (r > 15) {
      emit_ac_symbol(entropy, entropy->ac_tbl_no, 0xF0);
      r -= 16;
    }

    /* Find the number of bits needed for the magnitude of the coefficient */
    nbits = 1;			/* there must be at least one 1 bit */
    while ((temp >>= 1))
      nbits++;
    /* Check for out-of-range coefficient values */
    if (nbits > MAX_COEF_BITS)
      ERREXIT(cinfo, JERR_BAD_DCT_COEF);

    /* Count/emit Huffman symbol for run length / number of bits */
    emit_ac_symbol(entropy, entropy->ac_tbl_no, (r << 4) + nbits);

    /* Emit that number of bits of the value, if positive, */
    /* or the complement of its magnitude, if negative. */
    emit_bits_e(entropy, (unsigned int) temp2, nbits);

    r = 0;			/* reset zero run length */
  }

  if (r > 0) {			/* If there are trailing zeroes, */
    entropy->EOBRUN++;		/* count an EOB */
    if (entropy->EOBRUN == 0x7FFF)
      emit_eobrun(entropy);	/* force it out to avoid overflow */
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}